

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O1

void __thiscall
glslang::TIntermediate::mergeBlockDefinitions(TInfoSink&,glslang::TIntermSymbol*,glslang::
TIntermSymbol*,glslang::TIntermediate*)::TMergeBlockTraverser::visitSymbol(glslang::TIntermSymbol__
          (void *this,TIntermSymbol *symbol)

{
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *__x;
  char cVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_00;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_00;
  long *plVar4;
  undefined4 extraout_var_01;
  uint uVar5;
  char cVar6;
  
  this_00 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
            (**(code **)(**(long **)((long)this + 0x38) + 0x1a0))();
  iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])(symbol);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(this_00,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var,iVar2));
  if (iVar2 == 0) {
    lVar3 = (**(code **)(**(long **)((long)this + 0x38) + 0x110))();
    uVar5 = (uint)*(undefined8 *)(lVar3 + 8);
    if (((uVar5 & 0x7f) != 5) || (cVar1 = '\0', *(char *)(lVar3 + 0x2d) == '\x01')) {
      uVar5 = uVar5 & 0x7f;
      cVar1 = '\x02';
      if (uVar5 != 5) {
        cVar1 = (uVar5 != 6) * '\x02' + '\x01';
      }
    }
    iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(symbol);
    uVar5 = (uint)*(undefined8 *)(CONCAT44(extraout_var_00,iVar2) + 8);
    if (((uVar5 & 0x7f) != 5) ||
       (cVar6 = '\0', *(char *)(CONCAT44(extraout_var_00,iVar2) + 0x2d) == '\x01')) {
      uVar5 = uVar5 & 0x7f;
      cVar6 = '\x02';
      if (uVar5 != 5) {
        cVar6 = (uVar5 != 6) * '\x02' + '\x01';
      }
    }
    if (cVar1 == cVar6) {
      plVar4 = (long *)(**(code **)(**(long **)((long)this + 0x38) + 0xf0))();
      cVar1 = (**(code **)(*plVar4 + 0x128))(plVar4);
      if (cVar1 == '\0') {
        __assert_fail("isStruct()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                      ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
      }
      __x = (vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *)plVar4[0xd];
      iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1f])(symbol);
      plVar4 = (long *)CONCAT44(extraout_var_01,iVar2);
      cVar1 = (**(code **)(*plVar4 + 0x128))(plVar4);
      if (cVar1 != '\0') {
        std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::operator=
                  ((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *)
                   plVar4[0xd],__x);
        return;
      }
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9e1,"TTypeList *glslang::TType::getWritableStruct() const");
    }
  }
  return;
}

Assistant:

virtual void visitSymbol(TIntermSymbol* symbol)
        {
            if (newSymbol->getAccessName() == symbol->getAccessName() &&
                newSymbol->getQualifier().getBlockStorage() == symbol->getQualifier().getBlockStorage()) {
                // Each symbol node may have a local copy of the block structure.
                // Update those structures to match the new one post-merge
                *(symbol->getWritableType().getWritableStruct()) = *(newSymbol->getType().getStruct());
            }
        }